

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer pbVar5;
  cmInstallScriptGenerator *pcVar6;
  cmGlobalGenerator *this_00;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  pointer pbVar10;
  long lVar11;
  allocator local_a1;
  string script;
  string component;
  string local_50;
  
  std::__cxx11::string::string((string *)&component,(string *)&this->DefaultComponentName);
  iVar7 = 0;
  uVar9 = 0;
  while( true ) {
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar5 - (long)pbVar10 >> 5) <= uVar9) break;
    bVar3 = std::operator==(pbVar10 + uVar9,"COMPONENT");
    if ((bVar3) &&
       (uVar9 + 1 <
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5))) {
      std::__cxx11::string::_M_assign((string *)&component);
      iVar7 = iVar7 + 1;
      uVar9 = uVar9 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  if (iVar7 < 2) {
    lVar11 = 0;
    bVar3 = false;
    bVar2 = false;
    for (uVar9 = 0; uVar9 < (ulong)((long)pbVar5 - (long)pbVar10 >> 5); uVar9 = uVar9 + 1) {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar10->_M_dataplus)._M_p + lVar11),"SCRIPT");
      if (bVar4) {
        bVar3 = true;
LAB_0029f2a6:
        bVar2 = false;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar11),"CODE");
        if (bVar4) {
          bVar2 = true;
          bVar3 = false;
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar11),"COMPONENT");
          if (bVar4) {
            bVar3 = false;
            goto LAB_0029f2a6;
          }
          if (bVar3) {
            std::__cxx11::string::string
                      ((string *)&script,
                       (string *)
                       ((long)&(((args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11));
            bVar3 = cmsys::SystemTools::FileIsFullPath(script._M_dataplus._M_p);
            if (!bVar3) {
              cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
              std::__cxx11::string::assign((char *)&script);
              std::__cxx11::string::append((char *)&script);
              std::__cxx11::string::append((string *)&script);
            }
            bVar4 = cmsys::SystemTools::FileIsDirectory(&script);
            if (bVar4) {
              std::__cxx11::string::string
                        ((string *)&local_50,"given a directory as value of SCRIPT argument.",
                         &local_a1);
              cmCommand::SetError(&this->super_cmCommand,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              pcVar6 = (cmInstallScriptGenerator *)operator_new(0xe0);
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar6,script._M_dataplus._M_p,false,component._M_dataplus._M_p);
              cmMakefile::AddInstallGenerator(pcVar1,(cmInstallGenerator *)pcVar6);
            }
            std::__cxx11::string::~string((string *)&script);
            bVar3 = false;
            bVar8 = false;
            if (bVar4) goto LAB_0029f4b9;
          }
          else if (bVar2) {
            std::__cxx11::string::string
                      ((string *)&script,
                       (string *)
                       ((long)&(((args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11));
            pcVar1 = (this->super_cmCommand).Makefile;
            pcVar6 = (cmInstallScriptGenerator *)operator_new(0xe0);
            cmInstallScriptGenerator::cmInstallScriptGenerator
                      (pcVar6,script._M_dataplus._M_p,true,component._M_dataplus._M_p);
            cmMakefile::AddInstallGenerator(pcVar1,(cmInstallGenerator *)pcVar6);
            std::__cxx11::string::~string((string *)&script);
            goto LAB_0029f2a6;
          }
        }
      }
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x20;
    }
    if (bVar3) {
      std::__cxx11::string::string
                ((string *)&script,"given no value for SCRIPT argument.",(allocator *)&local_50);
      cmCommand::SetError(&this->super_cmCommand,&script);
    }
    else {
      if (!bVar2) {
        this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        bVar8 = true;
        cmGlobalGenerator::AddInstallComponent(this_00,component._M_dataplus._M_p);
        goto LAB_0029f4b9;
      }
      std::__cxx11::string::string
                ((string *)&script,"given no value for CODE argument.",(allocator *)&local_50);
      cmCommand::SetError(&this->super_cmCommand,&script);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&script,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,(allocator *)&local_50);
    cmCommand::SetError(&this->super_cmCommand,&script);
  }
  std::__cxx11::string::~string((string *)&script);
  bVar8 = false;
LAB_0029f4b9:
  std::__cxx11::string::~string((string *)&component);
  return bVar8;
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "COMPONENT" && i+1 < args.size())
        {
        ++componentCount;
        ++i;
        component = args[i];
        }
    }

  if(componentCount>1)
    {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
      "signature of the INSTALL command. "
      "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
    }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "SCRIPT")
      {
      doing_script = true;
      doing_code = false;
      }
    else if(args[i] == "CODE")
      {
      doing_script = false;
      doing_code = true;
      }
    else if(args[i] == "COMPONENT")
      {
      doing_script = false;
      doing_code = false;
      }
    else if(doing_script)
      {
      doing_script = false;
      std::string script = args[i];
      if(!cmSystemTools::FileIsFullPath(script.c_str()))
        {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += args[i];
        }
      if(cmSystemTools::FileIsDirectory(script))
        {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
        }
      this->Makefile->AddInstallGenerator(
        new cmInstallScriptGenerator(script.c_str(), false,
                                     component.c_str()));
      }
    else if(doing_code)
      {
      doing_code = false;
      std::string code = args[i];
      this->Makefile->AddInstallGenerator(
        new cmInstallScriptGenerator(code.c_str(), true,
                                     component.c_str()));
      }
    }

  if(doing_script)
    {
    this->SetError("given no value for SCRIPT argument.");
    return false;
    }
  if(doing_code)
    {
    this->SetError("given no value for CODE argument.");
    return false;
    }

  //Tell the global generator about any installation component names specified.
  this->Makefile->GetGlobalGenerator()
                             ->AddInstallComponent(component.c_str());

  return true;
}